

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varmap.cc
# Opt level: O0

void AliasChecker::gatherAdditiveBase
               (Varnode *startvn,
               vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_> *addbase)

{
  Varnode *this;
  pointer this_00;
  bool bVar1;
  OpCode OVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  reference ppPVar6;
  Varnode *pVVar7;
  AddBase local_d8;
  AddBase local_c8;
  AddBase local_b8;
  AddBase local_a8;
  _Self local_98;
  _List_node_base *local_90;
  AddBase local_88 [2];
  int local_68;
  byte local_61;
  int4 i;
  bool nonadduse;
  PcodeOp *op;
  const_iterator iter;
  Varnode *othervn;
  Varnode *indexvn;
  Varnode *subvn;
  Varnode *vn;
  vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_> vnqueue;
  vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_> *addbase_local;
  Varnode *startvn_local;
  
  vnqueue.super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)addbase;
  std::vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>::vector
            ((vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_> *)&vn);
  std::_List_const_iterator<PcodeOp_*>::_List_const_iterator((_List_const_iterator<PcodeOp_*> *)&op)
  ;
  local_68 = 0;
  Varnode::setMark(startvn);
  AddBase::AddBase(local_88,startvn,(Varnode *)0x0);
  std::vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>::push_back
            ((vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_> *)&vn,local_88);
  do {
    uVar3 = (ulong)local_68;
    sVar4 = std::vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>::size
                      ((vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_> *)&vn)
    ;
    if (sVar4 <= uVar3) {
      for (local_68 = 0; uVar3 = (ulong)local_68,
          sVar4 = std::vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>::size
                            ((vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>
                              *)&vn), uVar3 < sVar4; local_68 = local_68 + 1) {
        pvVar5 = std::vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>::
                 operator[]((vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_> *
                            )&vn,(long)local_68);
        Varnode::clearMark(pvVar5->base);
      }
      std::vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>::~vector
                ((vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_> *)&vn);
      return;
    }
    pvVar5 = std::vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>::operator[]
                       ((vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_> *)&vn
                        ,(long)local_68);
    this = pvVar5->base;
    sVar4 = (size_type)local_68;
    local_68 = local_68 + 1;
    pvVar5 = std::vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>::operator[]
                       ((vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_> *)&vn
                        ,sVar4);
    othervn = pvVar5->index;
    local_61 = 0;
    local_90 = (_List_node_base *)Varnode::beginDescend(this);
    op = (PcodeOp *)local_90;
    while( true ) {
      local_98._M_node = (_List_node_base *)Varnode::endDescend(this);
      bVar1 = std::operator!=((_Self *)&op,&local_98);
      this_00 = vnqueue.
                super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      if (!bVar1) break;
      ppPVar6 = std::_List_const_iterator<PcodeOp_*>::operator*
                          ((_List_const_iterator<PcodeOp_*> *)&op);
      _i = *ppPVar6;
      OVar2 = PcodeOp::code(_i);
      if (OVar2 == CPUI_COPY) {
        local_61 = 1;
        pVVar7 = PcodeOp::getOut(_i);
        bVar1 = Varnode::isMark(pVVar7);
        if (!bVar1) {
          Varnode::setMark(pVVar7);
          AddBase::AddBase(&local_a8,pVVar7,othervn);
          std::vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>::push_back
                    ((vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_> *)&vn,
                     &local_a8);
        }
      }
      else {
        if (OVar2 == CPUI_INT_ADD) {
LAB_00567fdf:
          iter._M_node = (_List_node_base *)PcodeOp::getIn(_i,1);
          if ((Varnode *)iter._M_node == this) {
            iter._M_node = (_List_node_base *)PcodeOp::getIn(_i,0);
          }
          bVar1 = Varnode::isConstant((Varnode *)iter._M_node);
          if (!bVar1) {
            othervn = (Varnode *)iter._M_node;
          }
        }
        else {
          if (OVar2 == CPUI_INT_SUB) {
            pVVar7 = PcodeOp::getIn(_i,1);
            if (this == pVVar7) {
              local_61 = 1;
            }
            else {
              iter._M_node = (_List_node_base *)PcodeOp::getIn(_i,1);
              bVar1 = Varnode::isConstant((Varnode *)iter._M_node);
              if (!bVar1) {
                othervn = (Varnode *)iter._M_node;
              }
              pVVar7 = PcodeOp::getOut(_i);
              bVar1 = Varnode::isMark(pVVar7);
              if (!bVar1) {
                Varnode::setMark(pVVar7);
                AddBase::AddBase(&local_b8,pVVar7,othervn);
                std::vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>::
                push_back((vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_> *)
                          &vn,&local_b8);
              }
            }
            goto LAB_005680c6;
          }
          if (OVar2 == CPUI_PTRADD) goto LAB_00567fdf;
          if (1 < OVar2 - CPUI_PTRSUB) {
            local_61 = 1;
            goto LAB_005680c6;
          }
        }
        pVVar7 = PcodeOp::getOut(_i);
        bVar1 = Varnode::isMark(pVVar7);
        if (!bVar1) {
          Varnode::setMark(pVVar7);
          AddBase::AddBase(&local_c8,pVVar7,othervn);
          std::vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>::push_back
                    ((vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_> *)&vn,
                     &local_c8);
        }
      }
LAB_005680c6:
      std::_List_const_iterator<PcodeOp_*>::operator++((_List_const_iterator<PcodeOp_*> *)&op);
    }
    if ((local_61 & 1) != 0) {
      AddBase::AddBase(&local_d8,this,othervn);
      std::vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>::push_back
                ((vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_> *)this_00,
                 &local_d8);
    }
  } while( true );
}

Assistant:

void AliasChecker::gatherAdditiveBase(Varnode *startvn,vector<AddBase> &addbase)

{
  vector<AddBase> vnqueue;		// varnodes involved in addition with original vn
  Varnode *vn,*subvn,*indexvn,*othervn;
  list<PcodeOp *>::const_iterator iter;
  PcodeOp *op;
  bool nonadduse;
  int4 i=0;

  vn = startvn;
  vn->setMark();
  vnqueue.push_back(AddBase(vn,(Varnode *)0));
  while(i<vnqueue.size()) {
    vn = vnqueue[i].base;
    indexvn = vnqueue[i++].index;
    nonadduse = false;
    for(iter=vn->beginDescend();iter!=vn->endDescend();++iter) {
      op = *iter;
      switch(op->code()) {
      case CPUI_COPY:
	nonadduse = true;	// Treat COPY as both non-add use and part of ADD expression
	subvn = op->getOut();
	if (!subvn->isMark()) {
	  subvn->setMark();
	  vnqueue.push_back(AddBase(subvn,indexvn));
	}
	break;
      case CPUI_INT_SUB:
	if (vn == op->getIn(1)) {	// Subtracting the pointer
	  nonadduse = true;
	  break;
	}
	othervn = op->getIn(1);
	if (!othervn->isConstant())
	  indexvn = othervn;
	subvn = op->getOut();
	if (!subvn->isMark()) {
	  subvn->setMark();
	  vnqueue.push_back(AddBase(subvn,indexvn));
	}
	break;
      case CPUI_INT_ADD:
      case CPUI_PTRADD:
	othervn = op->getIn(1);	// Check if something else is being added in besides a constant
	if (othervn == vn)
	  othervn = op->getIn(0);
	if (!othervn->isConstant())
	  indexvn = othervn;
	// fallthru
      case CPUI_PTRSUB:
      case CPUI_SEGMENTOP:
	subvn = op->getOut();
	if (!subvn->isMark()) {
	  subvn->setMark();
	  vnqueue.push_back(AddBase(subvn,indexvn));
	}
	break;
      default:
	nonadduse = true;	// Used in non-additive expression
      }
    }
    if (nonadduse)
      addbase.push_back(AddBase(vn,indexvn));
  }
  for(i=0;i<vnqueue.size();++i)
    vnqueue[i].base->clearMark();
}